

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::TestSpecParser::endMode(TestSpecParser *this)

{
  Mode MVar1;
  unique_ptr<Catch::TestSpec::NamePattern> uStack_38;
  string sStack_30;
  
  MVar1 = this->m_mode;
  if (MVar1 - Name < 2) {
    preprocessPattern_abi_cxx11_(&sStack_30,this);
    if (sStack_30._M_string_length != 0) {
      if (this->m_exclusion == true) {
        Detail::
        make_unique<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
                  ((Detail *)&uStack_38,&sStack_30,&this->m_substring);
        std::
        vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
        ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::NamePattern>>
                  ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                    *)&(this->m_currentFilter).m_forbidden,&uStack_38);
      }
      else {
        Detail::
        make_unique<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
                  ((Detail *)&uStack_38,&sStack_30,&this->m_substring);
        std::
        vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
        ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::NamePattern>>
                  ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                    *)&this->m_currentFilter,&uStack_38);
      }
      if (uStack_38.m_ptr != (NamePattern *)0x0) {
        (*((uStack_38.m_ptr)->super_Pattern)._vptr_Pattern[1])();
      }
    }
    (this->m_substring)._M_string_length = 0;
    *(this->m_substring)._M_dataplus._M_p = '\0';
    this->m_exclusion = false;
    this->m_mode = None;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_30._M_dataplus._M_p != &sStack_30.field_2) {
      operator_delete(sStack_30._M_dataplus._M_p,sStack_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  if (MVar1 != Tag) {
    if (MVar1 == EscapedName) {
      this->m_mode = this->lastMode;
      return;
    }
    this->m_mode = None;
    return;
  }
  preprocessPattern_abi_cxx11_(&sStack_30,this);
  if (sStack_30._M_string_length != 0) {
    if ((sStack_30._M_string_length != 1) && (*sStack_30._M_dataplus._M_p == '.')) {
      std::__cxx11::string::_M_erase((ulong)&sStack_30,0);
      if (this->m_exclusion == true) {
        Detail::make_unique<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                  ((Detail *)&uStack_38,(char (*) [2])0x180e56,&this->m_substring);
        std::
        vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
        ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                  ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                    *)&(this->m_currentFilter).m_forbidden,
                   (unique_ptr<Catch::TestSpec::TagPattern> *)&uStack_38);
      }
      else {
        Detail::make_unique<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                  ((Detail *)&uStack_38,(char (*) [2])0x180e56,&this->m_substring);
        std::
        vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
        ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                  ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                    *)&this->m_currentFilter,(unique_ptr<Catch::TestSpec::TagPattern> *)&uStack_38);
      }
      if (uStack_38.m_ptr != (NamePattern *)0x0) {
        (*((uStack_38.m_ptr)->super_Pattern)._vptr_Pattern[1])();
      }
    }
    if (this->m_exclusion == true) {
      Detail::make_unique<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
                ((Detail *)&uStack_38,&sStack_30,&this->m_substring);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                  *)&(this->m_currentFilter).m_forbidden,
                 (unique_ptr<Catch::TestSpec::TagPattern> *)&uStack_38);
    }
    else {
      Detail::make_unique<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
                ((Detail *)&uStack_38,&sStack_30,&this->m_substring);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                  *)&this->m_currentFilter,(unique_ptr<Catch::TestSpec::TagPattern> *)&uStack_38);
    }
    if (uStack_38.m_ptr != (NamePattern *)0x0) {
      (*((uStack_38.m_ptr)->super_Pattern)._vptr_Pattern[1])();
    }
  }
  (this->m_substring)._M_string_length = 0;
  *(this->m_substring)._M_dataplus._M_p = '\0';
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_30._M_dataplus._M_p != &sStack_30.field_2) {
    operator_delete(sStack_30._M_dataplus._M_p,sStack_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestSpecParser::endMode() {
        switch( m_mode ) {
        case Name:
        case QuotedName:
            return addNamePattern();
        case Tag:
            return addTagPattern();
        case EscapedName:
            revertBackToLastMode();
            return;
        case None:
        default:
            return startNewMode( None );
        }
    }